

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

int log_select_medium(log_handle *log,LOG_MEDIUM medium,char *target)

{
  uint32_t uVar1;
  long *plVar2;
  FILE *__stream;
  FILE *pFVar3;
  int *piVar4;
  int iVar5;
  
  iVar5 = 0;
  if (LOG_MEDIUM_EVENTLOG < medium) {
    return 0;
  }
  plVar2 = (long *)log->priv;
  switch(medium) {
  case LOG_MEDIUM_NONE:
    log->medium = 0;
    break;
  case LOG_MEDIUM_STDOUT:
    log->medium = 1;
    break;
  case LOG_MEDIUM_FILE:
    pFVar3 = fopen(target,"a");
    if (pFVar3 == (FILE *)0x0) {
      piVar4 = __errno_location();
      return -*piVar4;
    }
    uVar1 = log->medium;
    if (uVar1 != 4) {
      if (uVar1 == 3) {
        plVar2[1] = (long)pFVar3;
        log->medium = 2;
        closelog();
        return 0;
      }
      if (uVar1 == 2) {
        __stream = (FILE *)plVar2[1];
        plVar2[1] = (long)pFVar3;
        if (__stream == (FILE *)0x0) {
          return 0;
        }
        fclose(__stream);
        return 0;
      }
      plVar2[1] = (long)pFVar3;
      log->medium = 2;
      return 0;
    }
    plVar2[1] = (long)pFVar3;
    log->medium = 2;
    goto LAB_00103b83;
  case LOG_MEDIUM_SYSLOG:
    uVar1 = log->medium;
    if (uVar1 != 4) {
      if (uVar1 == 3) {
        return 0;
      }
      if (uVar1 == 2) {
        openlog("openelp",10,0x18);
        log->medium = 3;
        if ((FILE *)plVar2[1] == (FILE *)0x0) {
          return 0;
        }
        fclose((FILE *)plVar2[1]);
        plVar2[1] = 0;
        return 0;
      }
      openlog("openelp",10,0x18);
      log->medium = 3;
      return 0;
    }
    openlog("openelp",10,0x18);
    log->medium = 3;
LAB_00103b83:
    if (*plVar2 != 0) {
      *plVar2 = 0;
    }
    break;
  case LOG_MEDIUM_EVENTLOG:
    iVar5 = 0;
    if (log->medium != 4) {
      *plVar2 = 0;
      iVar5 = -0x5f;
    }
  }
  return iVar5;
}

Assistant:

int log_select_medium(struct log_handle *log, enum LOG_MEDIUM medium,
		      const char *target)
{
	struct log_priv *priv = log->priv;
	int ret = 0;

	/* Open the new medium */
	switch (medium) {
	case LOG_MEDIUM_NONE:
		log->medium = LOG_MEDIUM_NONE;
		switch (log->medium) {
		case LOG_MEDIUM_FILE:
			if (priv->medium_file.fp != NULL) {
				fclose(priv->medium_file.fp);
				priv->medium_file.fp = NULL;
			}

			break;
		case LOG_MEDIUM_SYSLOG:
			closelog();

			break;
		case LOG_MEDIUM_EVENTLOG:
			if (priv->medium_eventlog.handle != NULL) {
				DeregisterEventSource(priv->medium_eventlog.handle);
				priv->medium_eventlog.handle = NULL;
			}

			break;
		}
		break;
	case LOG_MEDIUM_STDOUT:
		log->medium = LOG_MEDIUM_STDOUT;
		switch (log->medium) {
		case LOG_MEDIUM_FILE:
			if (priv->medium_file.fp != NULL) {
				fclose(priv->medium_file.fp);
				priv->medium_file.fp = NULL;
			}

			break;
		case LOG_MEDIUM_SYSLOG:
			closelog();

			break;
		case LOG_MEDIUM_EVENTLOG:
			if (priv->medium_eventlog.handle != NULL) {
				DeregisterEventSource(priv->medium_eventlog.handle);
				priv->medium_eventlog.handle = NULL;
			}

			break;
		default:
			break;
		}

		break;
	case LOG_MEDIUM_FILE:
	{
		FILE *fp = fopen(target, "a");

		if (fp == NULL) {
			ret = -errno;
		} else {
			switch (log->medium) {
			case LOG_MEDIUM_FILE:
				if (priv->medium_file.fp != NULL) {
					FILE *old_fp = priv->medium_file.fp;

					priv->medium_file.fp = fp;
					fclose(old_fp);
				} else {
					priv->medium_file.fp = fp;
				}

				break;
			case LOG_MEDIUM_SYSLOG:
				priv->medium_file.fp = fp;
				log->medium = LOG_MEDIUM_FILE;
				closelog();

				break;
			case LOG_MEDIUM_EVENTLOG:
				priv->medium_file.fp = fp;
				log->medium = LOG_MEDIUM_FILE;
				if (priv->medium_eventlog.handle != NULL) {
					DeregisterEventSource(priv->medium_eventlog.handle);
					priv->medium_eventlog.handle = NULL;
				}

				break;
			default:
				priv->medium_file.fp = fp;
				log->medium = LOG_MEDIUM_FILE;

				break;
			}
		}

		break;
	}
	case LOG_MEDIUM_SYSLOG:
		switch (log->medium) {
		case LOG_MEDIUM_FILE:
			openlog("openelp", LOG_CONS | LOG_NDELAY, LOG_DAEMON);
			log->medium = LOG_MEDIUM_SYSLOG;
			if (priv->medium_file.fp != NULL) {
				fclose(priv->medium_file.fp);
				priv->medium_file.fp = NULL;
			}

			break;
		case LOG_MEDIUM_SYSLOG:
			break;
		case LOG_MEDIUM_EVENTLOG:
			openlog("openelp", LOG_CONS | LOG_NDELAY, LOG_DAEMON);
			log->medium = LOG_MEDIUM_SYSLOG;
			if (priv->medium_eventlog.handle != NULL) {
				DeregisterEventSource(priv->medium_eventlog.handle);
				priv->medium_eventlog.handle = NULL;
			}

			break;
		default:
			openlog("openelp", LOG_CONS | LOG_NDELAY, LOG_DAEMON);
			log->medium = LOG_MEDIUM_SYSLOG;

			break;
		}

		break;
	case LOG_MEDIUM_EVENTLOG:
		switch (log->medium) {
		case LOG_MEDIUM_FILE:
			priv->medium_eventlog.handle = RegisterEventSource(NULL, "OpenELP");
			if (priv->medium_eventlog.handle == NULL) {
				ret = EVENTLOG_ERRNO;
			} else {
				log->medium = LOG_MEDIUM_EVENTLOG;
				if (priv->medium_file.fp != NULL) {
					fclose(priv->medium_file.fp);
					priv->medium_file.fp = NULL;
				}
			}

			break;
		case LOG_MEDIUM_SYSLOG:
			priv->medium_eventlog.handle = RegisterEventSource(NULL, "OpenELP");
			if (priv->medium_eventlog.handle == NULL) {
				ret = EVENTLOG_ERRNO;
			} else {
				log->medium = LOG_MEDIUM_EVENTLOG;
				closelog();
			}

			break;
		case LOG_MEDIUM_EVENTLOG:
			break;
		default:
			priv->medium_eventlog.handle = RegisterEventSource(NULL, "OpenELP");
			if (priv->medium_eventlog.handle == NULL)
				ret = EVENTLOG_ERRNO;
			else
				log->medium = LOG_MEDIUM_EVENTLOG;

			break;
		}

		break;
	}

	return ret;
}